

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O0

void __thiscall
xray_re::xr_writer::
w_chunks<std::vector<xray_re::xr_mesh*,std::allocator<xray_re::xr_mesh*>>,xray_re::xr_writer::f_w_const<xray_re::xr_mesh>>
          (xr_writer *this,
          vector<xray_re::xr_mesh_*,_std::allocator<xray_re::xr_mesh_*>_> *container,
          f_w_const<xray_re::xr_mesh> write)

{
  bool bVar1;
  reference ppxVar2;
  uint32_t local_3c;
  const_iterator cStack_38;
  uint32_t id;
  const_iterator end;
  const_iterator it;
  vector<xray_re::xr_mesh_*,_std::allocator<xray_re::xr_mesh_*>_> *container_local;
  xr_writer *this_local;
  f_w_const<xray_re::xr_mesh> write_local;
  
  end = std::vector<xray_re::xr_mesh_*,_std::allocator<xray_re::xr_mesh_*>_>::begin(container);
  cStack_38 = std::vector<xray_re::xr_mesh_*,_std::allocator<xray_re::xr_mesh_*>_>::end(container);
  local_3c = 0;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&stack0xffffffffffffffc8);
    if (!bVar1) break;
    open_chunk(this,local_3c);
    ppxVar2 = __gnu_cxx::
              __normal_iterator<xray_re::xr_mesh_*const_*,_std::vector<xray_re::xr_mesh_*,_std::allocator<xray_re::xr_mesh_*>_>_>
              ::operator*(&end);
    f_w_const<xray_re::xr_mesh>::operator()
              ((f_w_const<xray_re::xr_mesh> *)&this_local,*ppxVar2,this);
    close_chunk(this);
    __gnu_cxx::
    __normal_iterator<xray_re::xr_mesh_*const_*,_std::vector<xray_re::xr_mesh_*,_std::allocator<xray_re::xr_mesh_*>_>_>
    ::operator++(&end);
    local_3c = local_3c + 1;
  }
  return;
}

Assistant:

inline void xr_writer::w_chunks(const T& container, F write)
{
	typename T::const_iterator it = container.begin(), end = container.end();
	for (uint32_t id = 0; it != end; ++it) {
		open_chunk(id++);
		write(*it, *this);
		close_chunk();
	}
}